

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  ulong *puVar1;
  Enum EVar2;
  Memory *args;
  pointer ppGVar3;
  Global *args_00;
  Table *args_01;
  DataSegment *pDVar4;
  Func *f;
  size_type sVar5;
  LoadStoreTracking *this_00;
  char cVar6;
  bool bVar7;
  Module *pMVar8;
  long *plVar9;
  pointer pTVar10;
  int iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char *args_1_00;
  ulong uVar12;
  char **ppcVar13;
  char **ppcVar14;
  Index IVar15;
  Type t;
  char cVar16;
  char (*args_2) [2];
  char cVar17;
  pointer ppFVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  pointer ppMVar22;
  pointer ppGVar23;
  pointer ppTVar24;
  pointer ppDVar25;
  _Alloc_hider _Var26;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string __str;
  string __str_1;
  string ds;
  char (*in_stack_fffffffffffffe78) [4];
  string local_170;
  string local_150;
  pointer local_130;
  string *local_128;
  Index local_11c;
  LoadStoreTracking *local_118;
  undefined1 local_110 [200];
  _Base_ptr local_48;
  Func **local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar8 = (this->mc).module;
  ppMVar22 = (pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar18 = (pointer)(pMVar8->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if ((pointer)ppMVar22 != ppFVar18) {
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_130 = ppFVar18;
    do {
      args = *ppMVar22;
      IVar15 = (Index)args_1;
      name._M_str = (args->name)._M_dataplus._M_p;
      name._M_len = (args->name)._M_string_length;
      bVar7 = CheckImportExport(this,__return_storage_ptr__,Memory,IVar15,name);
      cat<char[8],std::__cxx11::string>
                ((string *)local_110,(wabt *)"memory ",(char (*) [8])args,args_1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (!bVar7) {
        uVar19 = (args->page_limits).initial;
        cVar17 = '\x01';
        cVar16 = '\x01';
        if (9 < uVar19) {
          uVar12 = uVar19;
          cVar6 = '\x04';
          do {
            cVar16 = cVar6;
            if (uVar12 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_0012a6ce;
            }
            if (uVar12 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_0012a6ce;
            }
            if (uVar12 < 10000) goto LAB_0012a6ce;
            bVar7 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar16 + '\x04';
          } while (bVar7);
          cVar16 = cVar16 + '\x01';
        }
LAB_0012a6ce:
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_170,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_170._M_dataplus._M_p,(uint)local_170._M_string_length,uVar19);
        uVar19 = (args->page_limits).max;
        if (9 < uVar19) {
          uVar12 = uVar19;
          cVar16 = '\x04';
          do {
            cVar17 = cVar16;
            if (uVar12 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_0012a755;
            }
            if (uVar12 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_0012a755;
            }
            if (uVar12 < 10000) goto LAB_0012a755;
            bVar7 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar16 = cVar17 + '\x04';
          } while (bVar7);
          cVar17 = cVar17 + '\x01';
        }
LAB_0012a755:
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_150,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar19);
        cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)local_110,(wabt *)"(initial: ",(char (*) [11])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15fb61,
                   (char (*) [2])in_stack_fffffffffffffe78);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        ppFVar18 = local_130;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(IVar15 + 1);
      ppMVar22 = ppMVar22 + 1;
    } while ((pointer)ppMVar22 != ppFVar18);
    pMVar8 = (this->mc).module;
    if ((pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pMVar8->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar8 = (this->mc).module;
    }
  }
  ppGVar23 = (pMVar8->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar3 = (pMVar8->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar23 != ppGVar3) {
    IVar15 = 0;
    do {
      args_00 = *ppGVar23;
      ppcVar13 = (char **)(args_00->name)._M_dataplus._M_p;
      name_00._M_str = (char *)ppcVar13;
      name_00._M_len = (args_00->name)._M_string_length;
      bVar7 = CheckImportExport(this,__return_storage_ptr__,Global,IVar15,name_00);
      EVar2 = (args_00->type).enum_;
      local_170._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_170._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_170._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_170._M_dataplus._M_p = "uint";
        break;
      case ExternRef:
        local_170._M_dataplus._M_p = "externref";
        break;
      case FuncRef:
        local_170._M_dataplus._M_p = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_0012a8c8_caseD_fffffff1:
        local_170._M_dataplus._M_p = "ILLEGAL";
        break;
      case I16:
        local_170._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_170._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_170._M_dataplus._M_p = "double";
        break;
      case F32:
        local_170._M_dataplus._M_p = "float";
        break;
      case I64:
        local_170._M_dataplus._M_p = "long";
        break;
      case I32:
        local_170._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_170._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_0012a8c8_caseD_fffffff1;
          local_170._M_dataplus._M_p = "func";
        }
      }
      args_1_00 = ":";
      cat<char[8],std::__cxx11::string,char[2],char_const*>
                ((string *)local_110,(wabt *)"global ",(char (*) [8])args_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_170,ppcVar13);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (!bVar7) {
        InitExp_abi_cxx11_(&local_170,this,&args_00->init_expr);
        cat<char[4],std::__cxx11::string>
                  ((string *)local_110,(wabt *)" = ",(char (*) [4])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1_00);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar15 = IVar15 + 1;
      ppGVar23 = ppGVar23 + 1;
    } while (ppGVar23 != ppGVar3);
    pMVar8 = (this->mc).module;
    if ((pMVar8->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pMVar8->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar8 = (this->mc).module;
    }
  }
  ppTVar24 = (pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar18 = (pointer)(pMVar8->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if ((pointer)ppTVar24 != ppFVar18) {
    IVar15 = 0;
    local_130 = ppFVar18;
    do {
      args_01 = *ppTVar24;
      ppcVar13 = (char **)(args_01->name)._M_dataplus._M_p;
      name_01._M_str = (char *)ppcVar13;
      name_01._M_len = (args_01->name)._M_string_length;
      bVar7 = CheckImportExport(this,__return_storage_ptr__,Table,IVar15,name_01);
      EVar2 = (args_01->elem_type).enum_;
      local_170._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_170._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_170._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_170._M_dataplus._M_p = "uint";
        break;
      case ExternRef:
        local_170._M_dataplus._M_p = "externref";
        break;
      case FuncRef:
        local_170._M_dataplus._M_p = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_0012aae5_caseD_fffffff1:
        local_170._M_dataplus._M_p = "ILLEGAL";
        break;
      case I16:
        local_170._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_170._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_170._M_dataplus._M_p = "double";
        break;
      case F32:
        local_170._M_dataplus._M_p = "float";
        break;
      case I64:
        local_170._M_dataplus._M_p = "long";
        break;
      case I32:
        local_170._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_170._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_0012aae5_caseD_fffffff1;
          local_170._M_dataplus._M_p = "func";
        }
      }
      cat<char[7],std::__cxx11::string,char[2],char_const*>
                ((string *)local_110,(wabt *)"table ",(char (*) [7])args_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_170,ppcVar13);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (!bVar7) {
        uVar19 = (args_01->elem_limits).initial;
        cVar17 = '\x01';
        cVar16 = '\x01';
        if (9 < uVar19) {
          uVar12 = uVar19;
          cVar6 = '\x04';
          do {
            cVar16 = cVar6;
            if (uVar12 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_0012ac37;
            }
            if (uVar12 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_0012ac37;
            }
            if (uVar12 < 10000) goto LAB_0012ac37;
            bVar7 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar16 + '\x04';
          } while (bVar7);
          cVar16 = cVar16 + '\x01';
        }
LAB_0012ac37:
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_170,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_170._M_dataplus._M_p,(uint)local_170._M_string_length,uVar19);
        uVar19 = (args_01->elem_limits).max;
        if (9 < uVar19) {
          uVar12 = uVar19;
          cVar16 = '\x04';
          do {
            cVar17 = cVar16;
            if (uVar12 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_0012acbf;
            }
            if (uVar12 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_0012acbf;
            }
            if (uVar12 < 10000) goto LAB_0012acbf;
            bVar7 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar16 = cVar17 + '\x04';
          } while (bVar7);
          cVar17 = cVar17 + '\x01';
        }
LAB_0012acbf:
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_150,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_150._M_dataplus._M_p,(uint)local_150._M_string_length,uVar19);
        cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)local_110,(wabt *)"(min: ",(char (*) [7])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15fb61,
                   (char (*) [2])in_stack_fffffffffffffe78);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
        ppFVar18 = local_130;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar15 = IVar15 + 1;
      ppTVar24 = ppTVar24 + 1;
    } while ((pointer)ppTVar24 != ppFVar18);
    pMVar8 = (this->mc).module;
    if ((pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar8->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar8 = (this->mc).module;
    }
  }
  ppDVar25 = (pMVar8->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_130 = (pointer)(pMVar8->data_segments).
                       super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)ppDVar25 != local_130) {
    do {
      pDVar4 = *ppDVar25;
      InitExp_abi_cxx11_(&local_170,this,&pDVar4->offset);
      cat<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[4]>
                ((string *)local_110,(wabt *)"data ",(char (*) [6])&pDVar4->name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(offset: ",
                 (char (*) [10])&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") =",
                 in_stack_fffffffffffffe78);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      BinaryToString_abi_cxx11_((string *)local_110,this,&pDVar4->data);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_110._0_8_);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      ppDVar25 = ppDVar25 + 1;
    } while ((pointer)ppDVar25 != local_130);
    pMVar8 = (this->mc).module;
    if ((pMVar8->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar8->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar8 = (this->mc).module;
    }
  }
  local_130 = (pMVar8->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_38 = (pMVar8->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_130 != local_38) {
    local_40 = &this->cur_func;
    local_118 = &this->lst;
    local_48 = &(this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header;
    IVar15 = 0;
    local_128 = __return_storage_ptr__;
    do {
      f = *local_130;
      this->cur_func = f;
      args_2 = (char (*) [2])(f->name)._M_string_length;
      name_02._M_str = (f->name)._M_dataplus._M_p;
      name_02._M_len = (size_t)args_2;
      local_11c = IVar15;
      bVar7 = CheckImportExport(this,__return_storage_ptr__,First,IVar15,name_02);
      AST::AST((AST *)local_110,&this->mc,f);
      this->cur_ast = (AST *)local_110;
      if (!bVar7) {
        args_2 = (char (*) [2])0x1;
        AST::Construct((AST *)local_110,&f->exprs,
                       (Index)((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3),0,true)
        ;
        this_00 = local_118;
        LoadStoreTracking::Track(local_118,(Node *)local_110._8_8_);
        LoadStoreTracking::CheckLayouts(this_00);
      }
      cat<char[10],std::__cxx11::string,char[2]>
                (&local_170,(wabt *)"function ",(char (*) [10])f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x158700,
                 args_2);
      __return_storage_ptr__ = local_128;
      std::__cxx11::string::_M_append((char *)local_128,(ulong)local_170._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      pTVar10 = (f->decl).sig.param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((long)(f->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar10 & 0x7fffffff8U) != 0) {
        uVar19 = 0;
        do {
          cVar16 = (char)&local_150;
          if (uVar19 == 0) {
            t = *pTVar10;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            local_150._M_string_length = 0;
            local_150.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::push_back(cVar16);
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            t = (f->decl).sig.param_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19];
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            local_150._M_string_length = 0;
            local_150.field_2._M_local_buf[0] = '\0';
            uVar12 = uVar19 & 0xffffffff;
            do {
              uVar21 = (uint)uVar12;
              std::__cxx11::string::push_back(cVar16);
              uVar12 = (ulong)((int)(uVar12 / 0x1a) - 1);
            } while (0x19 < uVar21);
          }
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x151ec1);
          __return_storage_ptr__ = local_128;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          puVar1 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar1) {
            local_170.field_2._M_allocated_capacity = *puVar1;
            local_170.field_2._8_8_ = plVar9[3];
          }
          else {
            local_170.field_2._M_allocated_capacity = *puVar1;
            local_170._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_170._M_string_length = plVar9[1];
          *plVar9 = (long)puVar1;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,
                            CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                     local_150.field_2._M_local_buf[0]) + 1);
          }
          LocalDecl(&local_150,this,&local_170,t);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_150._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,
                            CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                     local_150.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          uVar19 = uVar19 + 1;
          pTVar10 = (f->decl).sig.param_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar19 < ((ulong)((long)(f->decl).sig.param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10)
                           >> 3 & 0xffffffff));
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pTVar10 = (f->decl).sig.result_types.
                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar11 = (int)((ulong)((long)(f->decl).sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10) >> 3);
      if (iVar11 != 0) {
        if (iVar11 == 1) {
          EVar2 = pTVar10->enum_;
          ppcVar13 = (char **)(ulong)(uint)(EVar2 + 0x11);
          if ((uint)(EVar2 + 0x11) < 0x19) {
            ppcVar14 = (char **)((long)&switchD_0012b298::switchdataD_001578b0 +
                                (long)(int)(&switchD_0012b298::switchdataD_001578b0)[(long)ppcVar13]
                                );
            local_150._M_dataplus._M_p = "byte";
            switch(ppcVar13) {
            case (char **)0x0:
              local_150._M_dataplus._M_p = "externref";
              break;
            case (char **)0x1:
              local_150._M_dataplus._M_p = "funcref";
              break;
            default:
switchD_0012b298_caseD_fffffff1:
              local_150._M_dataplus._M_p = "ILLEGAL";
              break;
            case (char **)0xa:
              local_150._M_dataplus._M_p = "short";
              break;
            case (char **)0xb:
              break;
            case (char **)0xc:
              local_150._M_dataplus._M_p = "simd";
              break;
            case (char **)0xd:
              local_150._M_dataplus._M_p = "double";
              break;
            case (char **)0xe:
              local_150._M_dataplus._M_p = "float";
              break;
            case (char **)0xf:
              local_150._M_dataplus._M_p = "long";
              break;
            case (char **)0x10:
              local_150._M_dataplus._M_p = "int";
              break;
            case (char **)0x15:
              local_150._M_dataplus._M_p = "ubyte";
              break;
            case (char **)0x17:
              local_150._M_dataplus._M_p = "ushort";
              break;
            case (char **)0x18:
              local_150._M_dataplus._M_p = "uint";
            }
          }
          else {
            ppcVar14 = ppcVar13;
            if (EVar2 == Void) {
              local_150._M_dataplus._M_p = "void";
            }
            else {
              if (EVar2 != Func) goto switchD_0012b298_caseD_fffffff1;
              local_150._M_dataplus._M_p = "func";
            }
          }
          cat<char[2],char_const*>(&local_170,(wabt *)":",(char (*) [2])&local_150,ppcVar14);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_170._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          pTVar10 = (f->decl).sig.result_types.
                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((long)(f->decl).sig.result_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pTVar10 & 0x7fffffff8U) != 0) {
            lVar20 = 0;
            uVar19 = 0;
            do {
              if (uVar19 != 0) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                pTVar10 = (pointer)((long)&((f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->enum_ +
                                   lVar20);
              }
              EVar2 = pTVar10->enum_;
              switch(EVar2) {
              case I8U:
                break;
              case I16U:
                break;
              case I32U:
                break;
              case ExternRef:
                break;
              case FuncRef:
                break;
              case 0xfffffff1:
              case 0xfffffff2:
              case 0xfffffff3:
              case FuncRef|I8U:
              case 0xfffffff5:
              case FuncRef|I16U:
              case FuncRef|I32U:
              case ~I32U:
              case Any:
              case ~I64:
              case ~F32:
              case ~F64:
              case ~I8:
switchD_0012b31b_caseD_fffffff1:
                break;
              case I16:
                break;
              case I8:
                break;
              case V128:
                break;
              case F64:
                break;
              case F32:
                break;
              case I64:
                break;
              case I32:
                break;
              default:
                if ((EVar2 != Void) && (EVar2 != Func)) goto switchD_0012b31b_caseD_fffffff1;
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              uVar19 = uVar19 + 1;
              pTVar10 = (f->decl).sig.result_types.
                        super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar20 = lVar20 + 8;
            } while (uVar19 < ((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pTVar10) >> 3 & 0xffffffff));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      if (bVar7) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        DecompileExpr((Value *)&local_170,this,(Node *)local_110._8_8_,(Node *)0x0);
        IndentValue(this,(Value *)&local_170,this->indent_amount,(string_view)ZEXT816(0));
        sVar5 = local_170._M_string_length;
        for (_Var26._M_p = local_170._M_dataplus._M_p; _Var26._M_p != (pointer)sVar5;
            _Var26._M_p = _Var26._M_p + 0x20) {
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)_Var26._M_p);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_170);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ModuleContext::EndFunc(&this->mc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                  *)local_118,
                 (_Link_type)(this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                );
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_48;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_48;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      IVar15 = local_11c + 1;
      *local_40 = (Func *)0x0;
      local_40[1] = (Func *)0x0;
      AST::~AST((AST *)local_110);
      local_130 = local_130 + 1;
    } while (local_130 != local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name, "(offset: ", InitExp(dat->offset), ") =");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      } else {
        s += " ";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), 0, true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += ";";
      } else {
        s += " {\n";
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }